

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

bool __thiscall
spvc_resources_s::copy_resources
          (spvc_resources_s *this,SmallVector<spvc_reflected_resource,_8UL> *outputs,
          SmallVector<spirv_cross::Resource,_8UL> *inputs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  Resource *i;
  Resource *pRVar4;
  spvc_reflected_resource local_40;
  
  pRVar4 = (inputs->super_VectorView<spirv_cross::Resource>).ptr;
  for (lVar3 = (inputs->super_VectorView<spirv_cross::Resource>).buffer_size * 0x30; lVar3 != 0;
      lVar3 = lVar3 + -0x30) {
    uVar1 = pRVar4->type_id;
    uVar2 = pRVar4->base_type_id;
    local_40.type_id = uVar1;
    local_40.base_type_id = uVar2;
    local_40.id = (pRVar4->id).id;
    local_40.name = spvc_context_s::allocate_name(this->context,&pRVar4->name);
    if (local_40.name == (char *)0x0) break;
    spirv_cross::SmallVector<spvc_reflected_resource,_8UL>::push_back(outputs,&local_40);
    pRVar4 = pRVar4 + 1;
  }
  return lVar3 == 0;
}

Assistant:

bool spvc_resources_s::copy_resources(SmallVector<spvc_reflected_resource> &outputs,
                                      const SmallVector<Resource> &inputs)
{
	for (auto &i : inputs)
	{
		spvc_reflected_resource r;
		r.base_type_id = i.base_type_id;
		r.type_id = i.type_id;
		r.id = i.id;
		r.name = context->allocate_name(i.name);
		if (!r.name)
			return false;

		outputs.push_back(r);
	}

	return true;
}